

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O2

void __thiscall
MemoryLeakDetectorList::clearAllAccounting(MemoryLeakDetectorList *this,MemLeakPeriod period)

{
  MemoryLeakDetectorNode *pMVar1;
  MemoryLeakDetectorNode *pMVar2;
  MemoryLeakDetectorNode *pMVar3;
  
  pMVar3 = this->head_;
  do {
    pMVar1 = (MemoryLeakDetectorNode *)0x0;
LAB_002b1a84:
    while( true ) {
      pMVar2 = pMVar3;
      if (pMVar2 == (MemoryLeakDetectorNode *)0x0) {
        return;
      }
      if (period == mem_leak_period_all) break;
      if ((pMVar2->period_ == period) ||
         (period == mem_leak_period_enabled && pMVar2->period_ != mem_leak_period_disabled)) break;
      pMVar3 = pMVar2->next_;
      pMVar1 = pMVar2;
    }
    pMVar3 = pMVar2->next_;
    if (pMVar1 != (MemoryLeakDetectorNode *)0x0) {
      pMVar1->next_ = pMVar3;
      goto LAB_002b1a84;
    }
    this->head_ = pMVar3;
  } while( true );
}

Assistant:

void MemoryLeakDetectorList::clearAllAccounting(MemLeakPeriod period)
{
    MemoryLeakDetectorNode* cur = head_;
    MemoryLeakDetectorNode* prev = NULLPTR;

    while (cur) {
        if (isInPeriod(cur, period)) {
            if (prev) {
                prev->next_ = cur->next_;
                cur = prev;
            }
            else {
                head_ = cur->next_;
                cur = head_;
                continue;
            }
        }
        prev = cur;
        cur = cur->next_;
    }
}